

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O0

aspa_status
aspa_table_update_in_place
          (aspa_table *aspa_table,rtr_socket *rtr_socket,aspa_update_operation *operations,
          size_t count,aspa_update_operation **failed_operation)

{
  aspa_array *array_00;
  aspa_status aVar1;
  aspa_update_operation *paVar2;
  aspa_record *paVar3;
  long in_FS_OFFSET;
  bool bVar4;
  bool bVar5;
  aspa_update_operation *local_90;
  _Bool next_matches_current;
  _Bool existing_matches_current;
  aspa_record *existing_record;
  aspa_update_operation *next;
  aspa_update_operation *current;
  size_t i;
  size_t existing_i;
  aspa_array *array;
  aspa_update_operation **failed_operation_local;
  size_t count_local;
  aspa_update_operation *operations_local;
  rtr_socket *rtr_socket_local;
  aspa_table *aspa_table_local;
  aspa_array *local_20;
  aspa_array *a;
  aspa_store_node **node;
  
  node = *(aspa_store_node ***)(in_FS_OFFSET + 0x28);
  if (aspa_table == (aspa_table *)0x0) {
    __assert_fail("aspa_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x268,
                  "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                 );
  }
  if (rtr_socket == (rtr_socket *)0x0) {
    __assert_fail("rtr_socket",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x269,
                  "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                 );
  }
  if (failed_operation == (aspa_update_operation **)0x0) {
    __assert_fail("failed_operation",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x26a,
                  "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                 );
  }
  if ((((aspa_table == (aspa_table *)0x0) || (rtr_socket == (rtr_socket *)0x0)) ||
      (failed_operation == (aspa_update_operation **)0x0)) ||
     ((count != 0 && (operations == (aspa_update_operation *)0x0)))) {
    aspa_table_local._4_4_ = ASPA_ERROR;
  }
  else if (count == 0) {
    aspa_table_local._4_4_ = ASPA_SUCCESS;
  }
  else {
    qsort(operations,count,0x30,compare_update_operations);
    pthread_rwlock_wrlock((pthread_rwlock_t *)aspa_table);
    a = (aspa_array *)aspa_store_get_node(&aspa_table->store,rtr_socket);
    if ((a == (aspa_array *)0x0) || (*(aspa_store_node **)a == (aspa_store_node *)0x0)) {
      local_20 = (aspa_array *)0x0;
      aVar1 = aspa_array_create(&local_20);
      if (aVar1 != ASPA_SUCCESS) {
        aspa_table_local._4_4_ = ASPA_ERROR;
        goto LAB_00113f40;
      }
      aVar1 = aspa_store_create_node(&aspa_table->store,rtr_socket,local_20,(aspa_store_node ***)&a)
      ;
      if (((aVar1 != ASPA_SUCCESS) || (a == (aspa_array *)0x0)) || (*(long *)a == 0)) {
        aspa_array_free(local_20,false);
        pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
        aspa_table_local._4_4_ = ASPA_ERROR;
        goto LAB_00113f40;
      }
    }
    if (a == (aspa_array *)0x0) {
      __assert_fail("node",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                    ,0x289,
                    "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                   );
    }
    if (*(long *)a == 0) {
      __assert_fail("*node",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                    ,0x28a,
                    "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                   );
    }
    if (**(long **)a == 0) {
      __assert_fail("(*node)->aspa_array",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                    ,0x28b,
                    "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                   );
    }
    array_00 = (aspa_array *)**(undefined8 **)a;
    i = 0;
    aspa_array_reserve(array_00,count + array_00->size);
    for (current = (aspa_update_operation *)0x0; current < count;
        current = (aspa_update_operation *)((long)&current->index + 1)) {
      paVar2 = operations + (long)current;
      if (current < (aspa_update_operation *)(count - 1)) {
        local_90 = operations + (long)((long)&current->index + 1);
      }
      else {
        local_90 = (aspa_update_operation *)0x0;
      }
      if (paVar2->type == ASPA_REMOVE) {
        if ((paVar2->record).provider_count != 0) {
          __assert_fail("current->record.provider_count == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                        ,0x29a,
                        "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                       );
        }
        if ((paVar2->record).provider_asns != (uint32_t *)0x0) {
          __assert_fail("!current->record.provider_asns",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                        ,0x29b,
                        "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                       );
        }
      }
      if (((paVar2->record).provider_count != 0) &&
         ((paVar2->record).provider_asns != (uint32_t *)0x0)) {
        qsort((paVar2->record).provider_asns,(paVar2->record).provider_count,4,compare_asns);
      }
      while( true ) {
        bVar4 = false;
        if (i < array_00->size) {
          paVar3 = aspa_array_get_record(array_00,i);
          bVar4 = paVar3->customer_asn < (paVar2->record).customer_asn;
        }
        if (!bVar4) break;
        i = i + 1;
      }
      paVar3 = aspa_array_get_record(array_00,i);
      bVar4 = false;
      if (paVar3 != (aspa_record *)0x0) {
        bVar4 = paVar3->customer_asn == (paVar2->record).customer_asn;
      }
      bVar5 = false;
      if (local_90 != (aspa_update_operation *)0x0) {
        bVar5 = (local_90->record).customer_asn == (paVar2->record).customer_asn;
      }
      if (paVar2->type == ASPA_ADD) {
        if (bVar4) {
          *failed_operation = paVar2;
          pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
          aspa_table_local._4_4_ = ASPA_DUPLICATE_RECORD;
          goto LAB_00113f40;
        }
        if ((!bVar5) || (local_90->type != ASPA_REMOVE)) {
          aVar1 = aspa_array_insert(array_00,i,&paVar2->record,true);
          if (aVar1 == ASPA_SUCCESS) goto LAB_00113f02;
          *failed_operation = paVar2;
          pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
          aspa_table_local._4_4_ = ASPA_ERROR;
          goto LAB_00113f40;
        }
        paVar2->is_no_op = true;
        local_90->is_no_op = true;
        current = (aspa_update_operation *)((long)&current->index + 1);
      }
      else {
        if (paVar2->type == ASPA_REMOVE) {
          if (!bVar4) {
            *failed_operation = paVar2;
            pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
            aspa_table_local._4_4_ = ASPA_RECORD_NOT_FOUND;
            goto LAB_00113f40;
          }
          (paVar2->record).provider_count = paVar3->provider_count;
          (paVar2->record).provider_asns = paVar3->provider_asns;
          aVar1 = aspa_array_remove(array_00,i,false);
          if (aVar1 != ASPA_SUCCESS) {
            *failed_operation = paVar2;
            pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
            aspa_table_local._4_4_ = ASPA_RECORD_NOT_FOUND;
            goto LAB_00113f40;
          }
        }
LAB_00113f02:
        aspa_table_notify_clients(aspa_table,&paVar2->record,rtr_socket,paVar2->type);
      }
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
    aspa_table_local._4_4_ = ASPA_SUCCESS;
  }
LAB_00113f40:
  if (*(aspa_store_node ***)(in_FS_OFFSET + 0x28) != node) {
    __stack_chk_fail();
  }
  return aspa_table_local._4_4_;
}

Assistant:

enum aspa_status aspa_table_update_in_place(struct aspa_table *aspa_table, struct rtr_socket *rtr_socket,
					    struct aspa_update_operation *operations, size_t count,
					    struct aspa_update_operation **failed_operation)
{
	// Fail hard in debug builds.
	assert(aspa_table);
	assert(rtr_socket);
	assert(failed_operation);

	if (!aspa_table || !rtr_socket || !failed_operation || ((count > 0) && !operations))
		return ASPA_ERROR;

	if (count == 0)
		return ASPA_SUCCESS;

	// stable sort operations, so operations dealing with the same customer ASN
	// are located right next to each other
	qsort(operations, count, sizeof(struct aspa_update_operation), compare_update_operations);

	pthread_rwlock_wrlock(&aspa_table->lock);
	struct aspa_store_node **node = aspa_store_get_node(&aspa_table->store, rtr_socket);

	if (!node || !*node) {
		// The given table doesn't have a node for that socket, so create one
		struct aspa_array *a = NULL;

		if (aspa_array_create(&a) != ASPA_SUCCESS)
			return ASPA_ERROR;

		// Insert into table
		if (aspa_store_create_node(&aspa_table->store, rtr_socket, a, &node) != ASPA_SUCCESS || !node ||
		    !*node) {
			aspa_array_free(a, false);
			pthread_rwlock_unlock(&aspa_table->lock);
			return ASPA_ERROR;
		}
	}

	assert(node);
	assert(*node);
	assert((*node)->aspa_array);

	struct aspa_array *array = (*node)->aspa_array;
	size_t existing_i = 0;

	// preemptively allocating enough space
	aspa_array_reserve(array, count + array->size);

	for (size_t i = 0; i < count; i++) {
		struct aspa_update_operation *current = &operations[i];
		struct aspa_update_operation *next = (i < count - 1) ? &(operations[i + 1]) : NULL;

#ifndef NDEBUG
		// Sanity check record
		if (current->type == ASPA_REMOVE) {
			assert(current->record.provider_count == 0);
			assert(!current->record.provider_asns);
		}
#endif

		// Sort providers.
		// We consider this an implementation detail, callers must not make any assumptions on the
		// ordering of provider ASNs.
		if (current->record.provider_count > 0 && current->record.provider_asns)
			qsort(current->record.provider_asns, current->record.provider_count, sizeof(uint32_t),
			      compare_asns);

		while (existing_i < array->size &&
		       aspa_array_get_record(array, existing_i)->customer_asn < current->record.customer_asn) {
			existing_i += 1;
		}

		struct aspa_record *existing_record = aspa_array_get_record(array, existing_i);

		// existing record and current op have matching CAS
		bool existing_matches_current = existing_record &&
						existing_record->customer_asn == current->record.customer_asn;

		// next record and current op have matching CAS
		bool next_matches_current = next && next->record.customer_asn == current->record.customer_asn;

		// MARK: Handling 'add' operations
		if (current->type == ASPA_ADD) {
			// Attempt to add record with $CAS, but record with $CAS already exists
			// Error: Duplicate Add.
			if (existing_matches_current) {
				*failed_operation = current;
				pthread_rwlock_unlock(&aspa_table->lock);
				return ASPA_DUPLICATE_RECORD;
			}

			// This operation adds a record with $CAS, the next op however removes this $CAS record again.
			if (next_matches_current && next->type == ASPA_REMOVE) {
#if ASPA_NOTIFY_NO_OPS
				// Complete record's providers for clients
				next->record = current->record;
				aspa_table_notify_clients(aspa_table, &current->record, rtr_socket, current->type);
				aspa_table_notify_clients(aspa_table, &next->record, rtr_socket, next->type);
#endif

				// Mark as no-op.
				current->is_no_op = true;
				next->is_no_op = true;

				// Skip next
				i += 1;
				continue;
			}

			// Add record by appending it to new array (copy providers)
			if (aspa_array_insert(array, existing_i, &current->record, true) != ASPA_SUCCESS) {
				*failed_operation = current;
				pthread_rwlock_unlock(&aspa_table->lock);
				return ASPA_ERROR;
			}
		}

		// MARK: Handling 'remove' operations
		else if (current->type == ASPA_REMOVE) {
			// Attempt to remove record with $CAS, but record with $CAS does not exist
			// Error: Removal of unknown record.
			if (!existing_matches_current) {
				*failed_operation = current;
				pthread_rwlock_unlock(&aspa_table->lock);
				return ASPA_RECORD_NOT_FOUND;
			}

			// If it's a remove operation, we insert a reference to the removed record's providers.
			current->record.provider_count = existing_record->provider_count;
			current->record.provider_asns = existing_record->provider_asns;

			// Remove record (don't release providers)
			if (aspa_array_remove(array, existing_i, false) != ASPA_SUCCESS) {
				*failed_operation = current;
				pthread_rwlock_unlock(&aspa_table->lock);
				return ASPA_RECORD_NOT_FOUND;
			}
		}

		// Notify clients
		aspa_table_notify_clients(aspa_table, &current->record, rtr_socket, current->type);
	}

	pthread_rwlock_unlock(&aspa_table->lock);
	return ASPA_SUCCESS;
}